

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_utils.hpp
# Opt level: O0

BaseException *
Args::eatOneValue<Args::CmdLine,Args::Context>
          (Context *context,String *errorDescription,CmdLine *cmdLine)

{
  bool bVar1;
  ArgIface *pAVar2;
  reference pbVar3;
  undefined8 uVar4;
  String *in_RCX;
  CmdLine *in_RDX;
  BaseException *in_RDI;
  iterator val;
  Context *in_stack_ffffffffffffff88;
  BaseException *this;
  string local_48 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  
  this = in_RDI;
  bVar1 = Context::atEnd((Context *)in_RDI);
  if (!bVar1) {
    local_28._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Context::next_abi_cxx11_(in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_28);
    pAVar2 = CmdLine::findArgument(in_RDX,in_RCX);
    if (pAVar2 == (ArgIface *)0x0) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
      std::__cxx11::string::string((string *)in_RDI,(string *)pbVar3);
      return this;
    }
    Context::putBack((Context *)this);
  }
  uVar4 = __cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_48,(string *)in_RDX);
  BaseException::BaseException(this,(String *)in_RDI);
  __cxa_throw(uVar4,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

String eatOneValue( Ctx & context,
	const String & errorDescription, Cmd * cmdLine )
{
	if( !context.atEnd() )
	{
		auto val = context.next();

		if( !cmdLine->findArgument( *val ) )
			return *val;

		context.putBack();
	}

	throw BaseException( errorDescription );
}